

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  float *pfVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar38;
  char *pcVar40;
  ulong uVar41;
  int iVar42;
  ulong uVar43;
  size_t sVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  float fVar59;
  float fVar60;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar61;
  undefined1 auVar57 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  float fVar62;
  float fVar75;
  float fVar76;
  vfloat4 v_2;
  float fVar77;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar93;
  vfloat4 v_3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar109;
  float fVar110;
  vfloat4 v_1;
  float fVar103;
  float fVar111;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar108;
  float fVar112;
  float fVar115;
  undefined1 auVar113 [16];
  float fVar116;
  undefined1 auVar114 [16];
  undefined4 uVar117;
  float fVar118;
  float fVar122;
  float fVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [12];
  float fVar124;
  float fVar131;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar132;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar129;
  undefined1 auVar130 [16];
  undefined1 auVar133 [12];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  vfloat4 v;
  float fVar142;
  size_t local_238;
  size_t local_230;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_228;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_208;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1c8 [16];
  ulong uVar39;
  undefined1 auVar128 [16];
  undefined1 auVar136 [16];
  
  aVar68 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       _DAT_01feb9f0;
  aVar94 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar68;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar94;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar41 = r->_begin;
  local_238 = __return_storage_ptr__->end;
  aVar93 = aVar94;
  aVar108 = aVar68;
  local_230 = k;
  if (uVar41 < r->_end) {
    do {
      uVar39 = *(ulong *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                          super_CurveGeometry.super_Geometry.field_0x58;
      uVar38 = *(uint *)(uVar39 + *(long *)&(this->
                                            super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                            ).super_CurveGeometry.field_0x68 * uVar41);
      uVar46 = (ulong)uVar38;
      uVar49 = (ulong)(uVar38 + 1);
      pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar49 < (pBVar5->super_RawBufferView).num) {
        pcVar40 = (pBVar5->super_RawBufferView).ptr_ofs;
        sVar44 = (pBVar5->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar40 + sVar44 * uVar46);
        auVar105._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
        auVar105._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
        auVar105._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
        auVar105._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
        auVar64._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
        auVar64._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
        auVar64._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
        auVar64._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
        iVar42 = movmskps((int)(sVar44 * uVar46),auVar64 | auVar105);
        if (iVar42 == 0) {
          uVar50 = (ulong)((this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                           super_CurveGeometry.super_Geometry.numTimeSteps - 1);
          pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.tangents.items;
          lVar47 = 0x38;
          uVar43 = 0;
          bVar51 = false;
          do {
            pfVar1 = (float *)(pcVar40 + sVar44 * uVar49);
            auVar95._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
            auVar95._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
            auVar95._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
            auVar95._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
            auVar127._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
            auVar127._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
            auVar127._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
            auVar127._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
            iVar42 = movmskps((int)uVar39,auVar127 | auVar95);
            if (iVar42 != 0) break;
            lVar7 = *(long *)((long)&pBVar6[-1].super_RawBufferView.ptr_ofs + lVar47);
            lVar8 = *(long *)((long)pBVar6 + lVar47 + -0x28);
            lVar45 = lVar8 * uVar46;
            pfVar1 = (float *)(lVar7 + lVar45);
            auVar96._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
            auVar96._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
            auVar96._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
            auVar96._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
            auVar78._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
            auVar78._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
            auVar78._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
            auVar78._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
            iVar42 = movmskps((int)lVar45,auVar78 | auVar96);
            if (iVar42 != 0) break;
            pfVar1 = (float *)(lVar7 + lVar8 * uVar49);
            auVar97._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
            auVar97._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
            auVar97._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
            auVar97._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
            auVar79._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
            auVar79._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
            auVar79._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
            auVar79._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
            iVar42 = movmskps((int)lVar7,auVar79 | auVar97);
            if (iVar42 != 0) break;
            if (uVar50 == uVar43) goto LAB_00a9410b;
            bVar51 = uVar50 <= uVar43;
            uVar43 = uVar43 + 1;
            pcVar40 = *(char **)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar47);
            sVar44 = *(size_t *)((long)&(pBVar5->super_RawBufferView).stride + lVar47);
            pfVar1 = (float *)(pcVar40 + sVar44 * uVar46);
            auVar98._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
            auVar98._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
            auVar98._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
            auVar98._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
            auVar80._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
            auVar80._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
            auVar80._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
            auVar80._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
            uVar38 = movmskps((int)(sVar44 * uVar46),auVar80 | auVar98);
            uVar39 = (ulong)uVar38;
            lVar47 = lVar47 + 0x38;
          } while (uVar38 == 0);
          if (bVar51) {
LAB_00a9410b:
            pcVar40 = (pBVar5->super_RawBufferView).ptr_ofs;
            sVar44 = (pBVar5->super_RawBufferView).stride;
            pfVar1 = (float *)(pcVar40 + sVar44 * uVar46);
            fVar118 = *pfVar1;
            fVar122 = pfVar1[1];
            fVar123 = pfVar1[2];
            pauVar2 = (undefined1 (*) [12])(pcVar40 + sVar44 * uVar49);
            fVar124 = *(float *)*pauVar2;
            fVar131 = *(float *)(*pauVar2 + 4);
            fVar132 = *(float *)(*pauVar2 + 8);
            pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            pcVar40 = (pBVar5->super_RawBufferView).ptr_ofs;
            sVar44 = (pBVar5->super_RawBufferView).stride;
            pfVar3 = (float *)(pcVar40 + uVar46 * sVar44);
            pfVar4 = (float *)(pcVar40 + sVar44 * uVar49);
            fVar111 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                      super_CurveGeometry.maxRadiusScale;
            fVar102 = pfVar1[3] * fVar111;
            fVar52 = *(float *)pauVar2[1] * fVar111;
            fVar62 = *pfVar3 * 0.33333334 + fVar118;
            fVar75 = pfVar3[1] * 0.33333334 + fVar122;
            fVar76 = pfVar3[2] * 0.33333334 + fVar123;
            fVar77 = pfVar3[3] * fVar111 * 0.33333334 + fVar102;
            fVar103 = fVar124 - *pfVar4 * 0.33333334;
            fVar109 = fVar131 - pfVar4[1] * 0.33333334;
            fVar110 = fVar132 - pfVar4[2] * 0.33333334;
            fVar111 = fVar52 - pfVar4[3] * fVar111 * 0.33333334;
            uVar38 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tessellationRate;
            uVar39 = (ulong)uVar38;
            if (uVar39 == 4) {
              auVar134._0_4_ =
                   fVar118 * (float)bezier_basis0._272_4_ +
                   fVar62 * (float)bezier_basis0._1428_4_ +
                   fVar103 * (float)bezier_basis0._2584_4_ + fVar124 * (float)bezier_basis0._3740_4_
              ;
              auVar134._4_4_ =
                   fVar118 * (float)bezier_basis0._276_4_ +
                   fVar62 * (float)bezier_basis0._1432_4_ +
                   fVar103 * (float)bezier_basis0._2588_4_ + fVar124 * (float)bezier_basis0._3744_4_
              ;
              auVar134._8_4_ =
                   fVar118 * (float)bezier_basis0._280_4_ +
                   fVar62 * (float)bezier_basis0._1436_4_ +
                   fVar103 * (float)bezier_basis0._2592_4_ + fVar124 * (float)bezier_basis0._3748_4_
              ;
              auVar134._12_4_ =
                   fVar118 * (float)bezier_basis0._284_4_ +
                   fVar62 * (float)bezier_basis0._1440_4_ +
                   fVar103 * (float)bezier_basis0._2596_4_ + fVar124 * (float)bezier_basis0._3752_4_
              ;
              auVar99._0_4_ =
                   fVar122 * (float)bezier_basis0._272_4_ +
                   fVar75 * (float)bezier_basis0._1428_4_ +
                   fVar109 * (float)bezier_basis0._2584_4_ + fVar131 * (float)bezier_basis0._3740_4_
              ;
              auVar99._4_4_ =
                   fVar122 * (float)bezier_basis0._276_4_ +
                   fVar75 * (float)bezier_basis0._1432_4_ +
                   fVar109 * (float)bezier_basis0._2588_4_ + fVar131 * (float)bezier_basis0._3744_4_
              ;
              auVar99._8_4_ =
                   fVar122 * (float)bezier_basis0._280_4_ +
                   fVar75 * (float)bezier_basis0._1436_4_ +
                   fVar109 * (float)bezier_basis0._2592_4_ + fVar131 * (float)bezier_basis0._3748_4_
              ;
              auVar99._12_4_ =
                   fVar122 * (float)bezier_basis0._284_4_ +
                   fVar75 * (float)bezier_basis0._1440_4_ +
                   fVar109 * (float)bezier_basis0._2596_4_ + fVar131 * (float)bezier_basis0._3752_4_
              ;
              auVar119._0_4_ =
                   fVar123 * (float)bezier_basis0._272_4_ +
                   fVar76 * (float)bezier_basis0._1428_4_ +
                   fVar110 * (float)bezier_basis0._2584_4_ + fVar132 * (float)bezier_basis0._3740_4_
              ;
              auVar119._4_4_ =
                   fVar123 * (float)bezier_basis0._276_4_ +
                   fVar76 * (float)bezier_basis0._1432_4_ +
                   fVar110 * (float)bezier_basis0._2588_4_ + fVar132 * (float)bezier_basis0._3744_4_
              ;
              auVar119._8_4_ =
                   fVar123 * (float)bezier_basis0._280_4_ +
                   fVar76 * (float)bezier_basis0._1436_4_ +
                   fVar110 * (float)bezier_basis0._2592_4_ + fVar132 * (float)bezier_basis0._3748_4_
              ;
              auVar119._12_4_ =
                   fVar123 * (float)bezier_basis0._284_4_ +
                   fVar76 * (float)bezier_basis0._1440_4_ +
                   fVar110 * (float)bezier_basis0._2596_4_ + fVar132 * (float)bezier_basis0._3752_4_
              ;
              auVar81._0_8_ = CONCAT44(auVar134._0_4_,auVar134._4_4_);
              auVar81._8_4_ = auVar134._12_4_;
              auVar81._12_4_ = auVar134._8_4_;
              auVar63._8_4_ = auVar134._12_4_;
              auVar63._0_8_ = auVar81._0_8_;
              auVar63._12_4_ = auVar134._8_4_;
              auVar64 = minps(auVar63,auVar134);
              auVar91._0_8_ = auVar64._8_8_;
              auVar91._8_4_ = auVar64._0_4_;
              auVar91._12_4_ = auVar64._4_4_;
              auVar64 = minps(auVar91,auVar64);
              auVar65._0_8_ = CONCAT44(auVar99._0_4_,auVar99._4_4_);
              auVar65._8_4_ = auVar99._12_4_;
              auVar65._12_4_ = auVar99._8_4_;
              auVar104._8_4_ = auVar99._12_4_;
              auVar104._0_8_ = auVar65._0_8_;
              auVar104._12_4_ = auVar99._8_4_;
              auVar105 = minps(auVar104,auVar99);
              auVar126._0_8_ = auVar105._8_8_;
              auVar126._8_4_ = auVar105._0_4_;
              auVar126._12_4_ = auVar105._4_4_;
              auVar127 = minps(auVar126,auVar105);
              auVar92._0_8_ = CONCAT44(auVar119._0_4_,auVar119._4_4_);
              auVar92._8_4_ = auVar119._12_4_;
              auVar92._12_4_ = auVar119._8_4_;
              auVar106._8_4_ = auVar119._12_4_;
              auVar106._0_8_ = auVar92._0_8_;
              auVar106._12_4_ = auVar119._8_4_;
              auVar105 = minps(auVar106,auVar119);
              auVar113._0_8_ = auVar105._8_8_;
              auVar113._8_4_ = auVar105._0_4_;
              auVar113._12_4_ = auVar105._4_4_;
              auVar105 = minps(auVar113,auVar105);
              auVar125._4_4_ = auVar127._0_4_;
              auVar125._0_4_ = auVar64._0_4_;
              auVar125._8_4_ = auVar105._0_4_;
              auVar64 = maxps(auVar81,auVar134);
              auVar107._0_8_ = auVar64._8_8_;
              auVar107._8_4_ = auVar64._0_4_;
              auVar107._12_4_ = auVar64._4_4_;
              auVar105 = maxps(auVar107,auVar64);
              auVar64 = maxps(auVar65,auVar99);
              auVar135._0_8_ = auVar64._8_8_;
              auVar135._8_4_ = auVar64._0_4_;
              auVar135._12_4_ = auVar64._4_4_;
              auVar127 = maxps(auVar135,auVar64);
              auVar64 = maxps(auVar92,auVar119);
              auVar66._0_8_ = auVar64._8_8_;
              auVar66._8_4_ = auVar64._0_4_;
              auVar66._12_4_ = auVar64._4_4_;
              auVar64 = maxps(auVar66,auVar64);
              auVar133._4_4_ = auVar127._0_4_;
              auVar133._0_4_ = auVar105._0_4_;
              auVar133._8_4_ = auVar64._0_4_;
              local_1c8._8_4_ =
                   ABS(fVar102 * (float)bezier_basis0._280_4_ +
                       fVar77 * (float)bezier_basis0._1436_4_ +
                       fVar111 * (float)bezier_basis0._2592_4_ +
                       fVar52 * (float)bezier_basis0._3748_4_);
              local_1c8._0_8_ =
                   CONCAT44(fVar102 * (float)bezier_basis0._276_4_ +
                            fVar77 * (float)bezier_basis0._1432_4_ +
                            fVar111 * (float)bezier_basis0._2588_4_ +
                            fVar52 * (float)bezier_basis0._3744_4_,
                            fVar102 * (float)bezier_basis0._272_4_ +
                            fVar77 * (float)bezier_basis0._1428_4_ +
                            fVar111 * (float)bezier_basis0._2584_4_ +
                            fVar52 * (float)bezier_basis0._3740_4_) & 0x7fffffff7fffffff;
              local_1c8._12_4_ =
                   ABS(fVar102 * (float)bezier_basis0._284_4_ +
                       fVar77 * (float)bezier_basis0._1440_4_ +
                       fVar111 * (float)bezier_basis0._2596_4_ +
                       fVar52 * (float)bezier_basis0._3752_4_);
            }
            else {
              if ((int)uVar38 < 1) {
                local_1c8 = ZEXT816(0);
                local_1f8 = 0xff800000;
                uStack_1f4 = 0xff800000;
                uStack_1f0 = 0xff800000;
                uStack_1ec = 0xff800000;
                local_1e8 = 0xff800000;
                uStack_1e4 = 0xff800000;
                uStack_1e0 = 0xff800000;
                uStack_1dc = 0xff800000;
                local_218 = 0xff800000;
                uStack_214 = 0xff800000;
                uStack_210 = 0xff800000;
                uStack_20c = 0xff800000;
                local_208.m128 = _DAT_01feb9f0;
                local_228.m128 = _DAT_01feb9f0;
                aVar58 = _DAT_01feb9f0;
              }
              else {
                lVar47 = uVar39 * 0x44;
                local_1c8 = ZEXT816(0);
                uVar49 = 0;
                local_228.m128 = _DAT_01feb9f0;
                local_208.m128 = _DAT_01feb9f0;
                local_218 = 0xff800000;
                uStack_214 = 0xff800000;
                uStack_210 = 0xff800000;
                uStack_20c = 0xff800000;
                local_1e8 = 0xff800000;
                uStack_1e4 = 0xff800000;
                uStack_1e0 = 0xff800000;
                uStack_1dc = 0xff800000;
                local_1f8 = 0xff800000;
                uStack_1f4 = 0xff800000;
                uStack_1f0 = 0xff800000;
                uStack_1ec = 0xff800000;
                aVar58 = _DAT_01feb9f0;
                do {
                  uVar48 = (uint)uVar49;
                  auVar100._0_4_ = -(uint)((int)uVar48 < (int)uVar38);
                  auVar100._4_4_ = -(uint)((int)(uVar48 | 1) < (int)uVar38);
                  auVar100._8_4_ = -(uint)((int)(uVar48 | 2) < (int)uVar38);
                  auVar100._12_4_ = -(uint)((int)(uVar48 | 3) < (int)uVar38);
                  pfVar1 = (float *)(lVar47 + 0x2227bec + uVar49 * 4);
                  fVar11 = *pfVar1;
                  fVar12 = pfVar1[1];
                  fVar13 = pfVar1[2];
                  fVar14 = pfVar1[3];
                  pfVar1 = (float *)(lVar47 + 0x2228070 + uVar49 * 4);
                  fVar15 = *pfVar1;
                  fVar16 = pfVar1[1];
                  fVar17 = pfVar1[2];
                  fVar18 = pfVar1[3];
                  pfVar1 = (float *)(lVar47 + 0x2227768 + uVar49 * 4);
                  fVar19 = *pfVar1;
                  fVar20 = pfVar1[1];
                  fVar21 = pfVar1[2];
                  fVar22 = pfVar1[3];
                  fVar112 = local_228.m128[0];
                  fVar115 = local_228.m128[2];
                  fVar116 = local_228.m128[3];
                  pfVar1 = (float *)(bezier_basis0 + uVar49 * 4 + lVar47);
                  fVar23 = *pfVar1;
                  fVar24 = pfVar1[1];
                  fVar25 = pfVar1[2];
                  fVar26 = pfVar1[3];
                  fVar53 = fVar118 * fVar23 + fVar62 * fVar19 + fVar103 * fVar11 + fVar124 * fVar15;
                  fVar59 = fVar118 * fVar24 + fVar62 * fVar20 + fVar103 * fVar12 + fVar124 * fVar16;
                  fVar60 = fVar118 * fVar25 + fVar62 * fVar21 + fVar103 * fVar13 + fVar124 * fVar17;
                  fVar61 = fVar118 * fVar26 + fVar62 * fVar22 + fVar103 * fVar14 + fVar124 * fVar18;
                  fVar139 = fVar123 * fVar23 + fVar76 * fVar19 + fVar110 * fVar11 + fVar132 * fVar15
                  ;
                  fVar140 = fVar123 * fVar24 + fVar76 * fVar20 + fVar110 * fVar12 + fVar132 * fVar16
                  ;
                  fVar141 = fVar123 * fVar25 + fVar76 * fVar21 + fVar110 * fVar13 + fVar132 * fVar17
                  ;
                  fVar142 = fVar123 * fVar26 + fVar76 * fVar22 + fVar110 * fVar14 + fVar132 * fVar18
                  ;
                  auVar29._4_4_ = uStack_1f4;
                  auVar29._0_4_ = local_1f8;
                  auVar29._8_4_ = uStack_1f0;
                  auVar29._12_4_ = uStack_1ec;
                  auVar33._4_4_ = fVar59;
                  auVar33._0_4_ = fVar53;
                  auVar33._8_4_ = fVar60;
                  auVar33._12_4_ = fVar61;
                  auVar64 = minps((undefined1  [16])local_208,auVar33);
                  auVar137._0_4_ = auVar64._0_4_ & auVar100._0_4_;
                  auVar137._4_4_ = auVar64._4_4_ & auVar100._4_4_;
                  auVar137._8_4_ = auVar64._8_4_ & auVar100._8_4_;
                  auVar137._12_4_ = auVar64._12_4_ & auVar100._12_4_;
                  local_208 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              (auVar137 | ~auVar100 & (undefined1  [16])local_208);
                  auVar27._4_4_ = uStack_214;
                  auVar27._0_4_ = local_218;
                  auVar27._8_4_ = uStack_210;
                  auVar27._12_4_ = uStack_20c;
                  auVar37._4_4_ =
                       fVar122 * fVar24 + fVar75 * fVar20 + fVar109 * fVar12 + fVar131 * fVar16;
                  auVar37._0_4_ =
                       fVar122 * fVar23 + fVar75 * fVar19 + fVar109 * fVar11 + fVar131 * fVar15;
                  auVar37._8_4_ =
                       fVar122 * fVar25 + fVar75 * fVar21 + fVar109 * fVar13 + fVar131 * fVar17;
                  auVar37._12_4_ =
                       fVar122 * fVar26 + fVar75 * fVar22 + fVar109 * fVar14 + fVar131 * fVar18;
                  auVar64 = minps((undefined1  [16])local_228,auVar37);
                  local_228.m128[1] =
                       (float)(auVar64._4_4_ & auVar100._4_4_ |
                              ~auVar100._4_4_ & (uint)local_228.m128[1]);
                  local_228.m128[0] =
                       (float)(auVar64._0_4_ & auVar100._0_4_ | ~auVar100._0_4_ & (uint)fVar112);
                  local_228.m128[2] =
                       (float)(auVar64._8_4_ & auVar100._8_4_ | ~auVar100._8_4_ & (uint)fVar115);
                  local_228.m128[3] =
                       (float)(auVar64._12_4_ & auVar100._12_4_ | ~auVar100._12_4_ & (uint)fVar116);
                  auVar85._0_4_ = ~auVar100._0_4_ & (uint)aVar58.m128[0];
                  auVar85._4_4_ = ~auVar100._4_4_ & (uint)aVar58.m128[1];
                  auVar85._8_4_ = ~auVar100._8_4_ & (uint)aVar58.m128[2];
                  auVar85._12_4_ = ~auVar100._12_4_ & (uint)aVar58.m128[3];
                  auVar35._4_4_ = fVar140;
                  auVar35._0_4_ = fVar139;
                  auVar35._8_4_ = fVar141;
                  auVar35._12_4_ = fVar142;
                  auVar64 = minps((undefined1  [16])aVar58,auVar35);
                  auVar57._0_4_ = auVar64._0_4_ & auVar100._0_4_;
                  auVar57._4_4_ = auVar64._4_4_ & auVar100._4_4_;
                  auVar57._8_4_ = auVar64._8_4_ & auVar100._8_4_;
                  auVar57._12_4_ = auVar64._12_4_ & auVar100._12_4_;
                  aVar58 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar57 | auVar85);
                  auVar34._4_4_ = fVar59;
                  auVar34._0_4_ = fVar53;
                  auVar34._8_4_ = fVar60;
                  auVar34._12_4_ = fVar61;
                  auVar64 = maxps(auVar29,auVar34);
                  local_1f8 = auVar64._0_4_ & auVar100._0_4_ | ~auVar100._0_4_ & local_1f8;
                  uStack_1f4 = auVar64._4_4_ & auVar100._4_4_ | ~auVar100._4_4_ & uStack_1f4;
                  uStack_1f0 = auVar64._8_4_ & auVar100._8_4_ | ~auVar100._8_4_ & uStack_1f0;
                  uStack_1ec = auVar64._12_4_ & auVar100._12_4_ | ~auVar100._12_4_ & uStack_1ec;
                  auVar31._4_4_ = uStack_1e4;
                  auVar31._0_4_ = local_1e8;
                  auVar31._8_4_ = uStack_1e0;
                  auVar31._12_4_ = uStack_1dc;
                  auVar64 = maxps(auVar31,auVar37);
                  local_1e8 = auVar64._0_4_ & auVar100._0_4_ | ~auVar100._0_4_ & local_1e8;
                  uStack_1e4 = auVar64._4_4_ & auVar100._4_4_ | ~auVar100._4_4_ & uStack_1e4;
                  uStack_1e0 = auVar64._8_4_ & auVar100._8_4_ | ~auVar100._8_4_ & uStack_1e0;
                  uStack_1dc = auVar64._12_4_ & auVar100._12_4_ | ~auVar100._12_4_ & uStack_1dc;
                  auVar36._4_4_ = fVar140;
                  auVar36._0_4_ = fVar139;
                  auVar36._8_4_ = fVar141;
                  auVar36._12_4_ = fVar142;
                  auVar64 = maxps(auVar27,auVar36);
                  local_218 = auVar64._0_4_ & auVar100._0_4_ | ~auVar100._0_4_ & local_218;
                  uStack_214 = auVar64._4_4_ & auVar100._4_4_ | ~auVar100._4_4_ & uStack_214;
                  uStack_210 = auVar64._8_4_ & auVar100._8_4_ | ~auVar100._8_4_ & uStack_210;
                  uStack_20c = auVar64._12_4_ & auVar100._12_4_ | ~auVar100._12_4_ & uStack_20c;
                  auVar114._0_8_ =
                       CONCAT44(fVar24 * fVar102 +
                                fVar20 * fVar77 + fVar12 * fVar111 + fVar16 * fVar52,
                                fVar23 * fVar102 +
                                fVar19 * fVar77 + fVar11 * fVar111 + fVar15 * fVar52) &
                       0x7fffffff7fffffff;
                  auVar114._8_4_ =
                       ABS(fVar25 * fVar102 + fVar21 * fVar77 + fVar13 * fVar111 + fVar17 * fVar52);
                  auVar114._12_4_ =
                       ABS(fVar26 * fVar102 + fVar22 * fVar77 + fVar14 * fVar111 + fVar18 * fVar52);
                  auVar64 = maxps(local_1c8,auVar114);
                  auVar86._0_4_ = auVar64._0_4_ & auVar100._0_4_;
                  auVar86._4_4_ = auVar64._4_4_ & auVar100._4_4_;
                  auVar86._8_4_ = auVar64._8_4_ & auVar100._8_4_;
                  auVar86._12_4_ = auVar64._12_4_ & auVar100._12_4_;
                  auVar101._0_4_ = ~auVar100._0_4_ & local_1c8._0_4_;
                  auVar101._4_4_ = ~auVar100._4_4_ & local_1c8._4_4_;
                  auVar101._8_4_ = ~auVar100._8_4_ & local_1c8._8_4_;
                  auVar101._12_4_ = ~auVar100._12_4_ & local_1c8._12_4_;
                  local_1c8 = auVar101 | auVar86;
                  uVar49 = uVar49 + 4;
                } while (uVar49 < uVar39);
              }
              auVar69._4_4_ = local_208.m128[0];
              auVar69._0_4_ = local_208.m128[1];
              auVar69._8_4_ = local_208.m128[3];
              auVar69._12_4_ = local_208.m128[2];
              auVar64 = minps(auVar69,(undefined1  [16])local_208);
              auVar87._0_8_ = auVar64._8_8_;
              auVar87._8_4_ = auVar64._0_4_;
              auVar87._12_4_ = auVar64._4_4_;
              auVar105 = minps(auVar87,auVar64);
              auVar70._4_4_ = local_228.m128[0];
              auVar70._0_4_ = local_228.m128[1];
              auVar70._8_4_ = local_228.m128[3];
              auVar70._12_4_ = local_228.m128[2];
              auVar64 = minps(auVar70,(undefined1  [16])local_228);
              auVar130._0_8_ = auVar64._8_8_;
              auVar130._8_4_ = auVar64._0_4_;
              auVar130._12_4_ = auVar64._4_4_;
              auVar127 = minps(auVar130,auVar64);
              auVar71._4_4_ = aVar58.m128[0];
              auVar71._0_4_ = aVar58.m128[1];
              auVar71._8_4_ = aVar58.m128[3];
              auVar71._12_4_ = aVar58.m128[2];
              auVar64 = minps(auVar71,(undefined1  [16])aVar58);
              auVar88._0_8_ = auVar64._8_8_;
              auVar88._8_4_ = auVar64._0_4_;
              auVar88._12_4_ = auVar64._4_4_;
              auVar64 = minps(auVar88,auVar64);
              auVar125._4_4_ = auVar127._0_4_;
              auVar125._0_4_ = auVar105._0_4_;
              auVar125._8_4_ = auVar64._0_4_;
              auVar30._4_4_ = uStack_1f4;
              auVar30._0_4_ = local_1f8;
              auVar30._8_4_ = uStack_1f0;
              auVar30._12_4_ = uStack_1ec;
              auVar72._4_4_ = local_1f8;
              auVar72._0_4_ = uStack_1f4;
              auVar72._8_4_ = uStack_1ec;
              auVar72._12_4_ = uStack_1f0;
              auVar64 = maxps(auVar72,auVar30);
              auVar89._0_8_ = auVar64._8_8_;
              auVar89._8_4_ = auVar64._0_4_;
              auVar89._12_4_ = auVar64._4_4_;
              auVar105 = maxps(auVar89,auVar64);
              auVar32._4_4_ = uStack_1e4;
              auVar32._0_4_ = local_1e8;
              auVar32._8_4_ = uStack_1e0;
              auVar32._12_4_ = uStack_1dc;
              auVar73._4_4_ = local_1e8;
              auVar73._0_4_ = uStack_1e4;
              auVar73._8_4_ = uStack_1dc;
              auVar73._12_4_ = uStack_1e0;
              auVar64 = maxps(auVar73,auVar32);
              auVar138._0_8_ = auVar64._8_8_;
              auVar138._8_4_ = auVar64._0_4_;
              auVar138._12_4_ = auVar64._4_4_;
              auVar127 = maxps(auVar138,auVar64);
              auVar28._4_4_ = uStack_214;
              auVar28._0_4_ = local_218;
              auVar28._8_4_ = uStack_210;
              auVar28._12_4_ = uStack_20c;
              auVar74._4_4_ = local_218;
              auVar74._0_4_ = uStack_214;
              auVar74._8_4_ = uStack_20c;
              auVar74._12_4_ = uStack_210;
              auVar64 = maxps(auVar74,auVar28);
              auVar90._0_8_ = auVar64._8_8_;
              auVar90._8_4_ = auVar64._0_4_;
              auVar90._12_4_ = auVar64._4_4_;
              auVar64 = maxps(auVar90,auVar64);
              auVar133._4_4_ = auVar127._0_4_;
              auVar133._0_4_ = auVar105._0_4_;
              auVar133._8_4_ = auVar64._0_4_;
            }
            auVar136._12_4_ = 0;
            auVar136._0_12_ = auVar133;
            auVar128._12_4_ = 0;
            auVar128._0_12_ = auVar125;
            auVar120._4_4_ = local_1c8._0_4_;
            auVar120._0_4_ = local_1c8._4_4_;
            auVar120._8_4_ = local_1c8._12_4_;
            auVar120._12_4_ = local_1c8._8_4_;
            auVar64 = maxps(auVar120,local_1c8);
            uVar117 = auVar64._0_4_;
            auVar121._8_4_ = auVar64._8_4_;
            auVar67._4_4_ = uVar117;
            auVar67._0_4_ = uVar117;
            auVar67._8_4_ = uVar117;
            auVar67._12_4_ = uVar117;
            auVar121._4_4_ = auVar121._8_4_;
            auVar121._0_4_ = auVar121._8_4_;
            auVar121._12_4_ = auVar121._8_4_;
            auVar64 = maxps(auVar121,auVar67);
            auVar9._12_4_ = fVar52;
            auVar9._0_12_ = *pauVar2;
            auVar105 = minps(auVar128,auVar9);
            auVar10._12_4_ = fVar52;
            auVar10._0_12_ = *pauVar2;
            auVar127 = maxps(auVar136,auVar10);
            auVar54._0_8_ = CONCAT44(fVar52,fVar52) & 0x7fffffff7fffffff;
            auVar54._8_4_ = ABS(fVar52);
            auVar54._12_4_ = ABS(fVar52);
            auVar64 = maxps(auVar64,auVar54);
            fVar124 = auVar105._0_4_ - auVar64._0_4_;
            fVar131 = auVar105._4_4_ - auVar64._4_4_;
            fVar132 = auVar105._8_4_ - auVar64._8_4_;
            fVar118 = auVar64._0_4_ + auVar127._0_4_;
            fVar122 = auVar64._4_4_ + auVar127._4_4_;
            fVar123 = auVar64._8_4_ + auVar127._8_4_;
            auVar82._0_8_ = CONCAT44(fVar131,fVar124) & 0x7fffffff7fffffff;
            auVar82._8_4_ = ABS(fVar132);
            auVar82._12_4_ = ABS(auVar105._12_4_ - auVar64._12_4_);
            auVar55._0_8_ = CONCAT44(fVar122,fVar118) & 0x7fffffff7fffffff;
            auVar55._8_4_ = ABS(fVar123);
            auVar55._12_4_ = ABS(auVar64._12_4_ + auVar127._12_4_);
            auVar64 = maxps(auVar82,auVar55);
            fVar111 = auVar64._4_4_;
            if (auVar64._4_4_ <= auVar64._0_4_) {
              fVar111 = auVar64._0_4_;
            }
            auVar83._8_8_ = auVar64._8_8_;
            auVar83._0_8_ = auVar64._8_8_;
            if (auVar64._8_4_ <= fVar111) {
              auVar83._0_4_ = fVar111;
            }
            fVar111 = auVar83._0_4_ * 4.7683716e-07;
            aVar129._0_4_ = fVar124 - fVar111;
            aVar129._4_4_ = fVar131 - fVar111;
            aVar129._8_4_ = fVar132 - fVar111;
            aVar84._0_4_ = fVar111 + fVar118;
            aVar84._4_4_ = fVar111 + fVar122;
            aVar84._8_4_ = fVar111 + fVar123;
            aVar129.m128[3] = (float)geomID;
            aVar84.m128[3] = (float)uVar41;
            aVar68.m128 = (__m128)minps(aVar68.m128,aVar129.m128);
            aVar93.m128 = (__m128)maxps(aVar93.m128,aVar84.m128);
            auVar56._0_4_ = aVar129._0_4_ + aVar84._0_4_;
            auVar56._4_4_ = aVar129._4_4_ + aVar84._4_4_;
            auVar56._8_4_ = aVar129._8_4_ + aVar84._8_4_;
            auVar56._12_4_ = (float)geomID + (float)uVar41;
            aVar108.m128 = (__m128)minps(aVar108.m128,auVar56);
            aVar94.m128 = (__m128)maxps(aVar94.m128,auVar56);
            local_238 = local_238 + 1;
            prims[local_230].lower.field_0 = aVar129;
            prims[local_230].upper.field_0 = aVar84;
            local_230 = local_230 + 1;
          }
        }
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar68;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar93;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar108;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar94;
  __return_storage_ptr__->end = local_238;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }